

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::basic_substring<const_char>::first_of
          (basic_substring<const_char> *this,ro_substr chars,size_t start)

{
  char cVar1;
  bool bVar2;
  error_flags eVar3;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t j;
  size_t i;
  bool local_71;
  ulong local_68;
  ulong local_60;
  long local_38;
  ulong local_30;
  char *local_20;
  undefined4 local_18;
  ulong local_10;
  long *local_8;
  
  local_71 = true;
  if (in_RCX != 0xffffffffffffffff) {
    local_71 = in_RCX <= (ulong)in_RDI[1];
  }
  local_60 = in_RCX;
  local_38 = in_RSI;
  local_30 = in_RDX;
  if (!local_71) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    handle_error(0x3f0daf,(char *)0x171d,"check failed: %s",
                 "start == npos || (start >= 0 && start <= len)");
  }
  do {
    if ((ulong)in_RDI[1] <= local_60) {
      return 0xffffffffffffffff;
    }
    for (local_68 = 0; local_68 < local_30; local_68 = local_68 + 1) {
      cVar1 = *(char *)(*in_RDI + local_60);
      local_8 = &local_38;
      local_10 = local_68;
      if (local_30 <= local_68) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        local_20 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_18 = 0x14c3;
        handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (cVar1 == *(char *)(local_38 + local_10)) {
        return local_60;
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

size_t first_of(ro_substr chars, size_t start=0) const
    {
        C4_ASSERT(start == npos || (start >= 0 && start <= len));
        for(size_t i = start; i < len; ++i)
        {
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars[j])
                    return i;
            }
        }
        return npos;
    }